

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::mergeChannels(Image *__return_storage_ptr__,Image *_red,Image *_green,Image *_blue)

{
  int iVar1;
  int iVar2;
  uint _width;
  uint _height;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  int x;
  char *pcVar6;
  ulong uVar7;
  Image *_mother;
  long lVar8;
  undefined1 local_4c [12];
  ulong local_40;
  ulong local_38;
  
  iVar1 = (*_red->_vptr_Image[8])(_red);
  pcVar6 = "ERROR: mergeChannel() arguments must be all grayscale images";
  _mother = _red;
  if (((iVar1 < 2) && (iVar1 = (*_green->_vptr_Image[8])(_green), iVar1 < 2)) &&
     (iVar1 = (*_blue->_vptr_Image[8])(), iVar1 < 2)) {
    iVar1 = (*_red->_vptr_Image[6])(_red);
    iVar2 = (*_green->_vptr_Image[6])(_green);
    pcVar6 = "ERROR: mergeChannel() all images must be the same size";
    _mother = _green;
    if (iVar1 == iVar2) {
      iVar1 = (*_red->_vptr_Image[6])(_red);
      iVar2 = (*_blue->_vptr_Image[6])();
      if (iVar1 == iVar2) {
        iVar1 = (*_red->_vptr_Image[7])(_red);
        iVar2 = (*_green->_vptr_Image[7])(_green);
        if (iVar1 == iVar2) {
          iVar1 = (*_red->_vptr_Image[7])(_red);
          iVar2 = (*_blue->_vptr_Image[7])();
          if (iVar1 == iVar2) {
            _width = (*_red->_vptr_Image[6])(_red);
            _height = (*_red->_vptr_Image[7])(_red);
            Image::Image(__return_storage_ptr__,_width,_height,3);
            uVar5 = 0;
            local_38 = (ulong)_width;
            if ((int)_width < 1) {
              local_38 = uVar5;
            }
            if ((int)_height < 1) {
              _height = 0;
            }
            local_40 = (ulong)_height;
            for (; uVar5 != local_40; uVar5 = uVar5 + 1) {
              for (uVar7 = 0; local_38 != uVar7; uVar7 = uVar7 + 1) {
                iVar3 = (*_red->_vptr_Image[0xe])(_red,uVar7,uVar5);
                iVar1 = __return_storage_ptr__->m_width;
                iVar2 = __return_storage_ptr__->m_channels;
                lVar8 = (long)iVar3;
                (*_red->_vptr_Image[0x18])(_red,lVar8);
                (*_green->_vptr_Image[0x18])(_green,lVar8);
                (*_blue->_vptr_Image[0x18])(_blue,lVar8);
                (*__return_storage_ptr__->_vptr_Image[0x12])
                          (__return_storage_ptr__,((long)iVar1 * uVar5 + uVar7) * (long)iVar2,
                           local_4c,3);
              }
            }
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  Image::Image(__return_storage_ptr__,_mother);
  return __return_storage_ptr__;
}

Assistant:

Image mergeChannels(const Image& _red, const Image& _green, const Image& _blue) {
    if (_red.getChannels() > 1 ||
        _green.getChannels() > 1 ||
        _blue.getChannels() > 1 ) {
        std::cout << "ERROR: mergeChannel() arguments must be all grayscale images" << std::endl;
        return _red;
    }

    if (_red.getWidth() != _green.getWidth() || _red.getWidth() != _blue.getWidth() ||
        _red.getHeight() != _green.getHeight() || _red.getHeight() != _blue.getHeight()) {
        std::cout << "ERROR: mergeChannel() all images must be the same size" << std::endl;
        return _green;
    }
    int width = _red.getWidth();
    int height = _red.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            int index = _red.getIndex(x, y);
            out.setColor(   out.getIndex(x,y), 
                            glm::vec3(_red.getValue(index), _green.getValue(index), _blue.getValue(index)));
        }
    }
    return out;
}